

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall helics::apps::Clone::~Clone(Clone *this)

{
  bool bVar1;
  App *in_RDI;
  deque<helics::Input,_std::allocator<helics::Input>_> *in_stack_00000030;
  string *in_stack_00000698;
  Clone *in_stack_000006a0;
  vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
  *in_stack_fffffffffffffff0;
  
  ((_Alloc_hider *)&in_RDI->_vptr_App)->_M_p = (pointer)&PTR__Clone_00a47690;
  if (((ulong)((_Alloc_hider *)&in_RDI[1]._vptr_App)->_M_p & 0x10000) == 0) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x41e79c
                      );
    if (!bVar1) {
      saveFile(in_stack_000006a0,in_stack_00000698);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffff0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *)0x41e821);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
          *)0x41e832);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *)0x41e843);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
          *)0x41e854);
  std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             *)in_stack_fffffffffffffff0);
  CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::~unique_ptr
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffff0);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::~deque(in_stack_00000030);
  CLI::std::
  vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
  ~vector(in_stack_fffffffffffffff0);
  std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::~unique_ptr
            ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             in_stack_fffffffffffffff0);
  App::~App(in_RDI);
  return;
}

Assistant:

Clone::~Clone()
{
    try {
        if (!fileSaved && !outFileName.empty()) {
            saveFile(outFileName);
        }
    }
    catch (...) {
        // destructors should not throw
        ;
    }
}